

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_io.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
draco::ReadMeshFromFile(string *file_name)

{
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *in_RDI;
  Options options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000448;
  Options *in_stack_00000450;
  string *in_stack_00000458;
  
  Options::Options((Options *)0x117f29);
  ReadMeshFromFile(in_stack_00000458,in_stack_00000450,in_stack_00000448);
  Options::~Options((Options *)0x117f4d);
  return in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> ReadMeshFromFile(const std::string &file_name) {
  const Options options;
  return ReadMeshFromFile(file_name, options, nullptr);
}